

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

bool QAtomicOps<int>::deref<int>(atomic<int> *_q_value)

{
  int iVar1;
  atomic<int> *_q_value_local;
  
  LOCK();
  iVar1 = (_q_value->super___atomic_base<int>)._M_i;
  (_q_value->super___atomic_base<int>)._M_i = (_q_value->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  return iVar1 != 1;
}

Assistant:

static inline bool deref(std::atomic<T> &_q_value) noexcept
    {
        // compare with ref
        return _q_value.fetch_sub(1, std::memory_order_acq_rel) != T(1);
    }